

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O2

TestCase *
vkt::
createFunctionCaseWithPrograms<vkt::tessellation::(anonymous_namespace)::TessCoordComponent::CaseDefinition>
          (TestContext *testCtx,TestNodeType type,string *name,string *desc,Function initPrograms,
          Function testFunction,CaseDefinition arg0)

{
  TestCase *this;
  undefined4 in_register_00000034;
  
  this = (TestCase *)operator_new(0x98);
  TestCase::TestCase(this,testCtx,NODETYPE_SELF_VALIDATE,
                     (string *)CONCAT44(in_register_00000034,type),name);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00c08e58;
  this[1].super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)tessellation::anon_unknown_0::TessCoordComponent::initPrograms;
  this[1].super_TestCase.super_TestNode.m_testCtx =
       (TestContext *)tessellation::anon_unknown_0::TessCoordComponent::test;
  this[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)arg0._0_8_;
  this[1].super_TestCase.super_TestNode.m_name._M_string_length = arg0._8_8_;
  *(undefined4 *)&this[1].super_TestCase.super_TestNode.m_name.field_2 = arg0._16_4_;
  return this;
}

Assistant:

TestCase* createFunctionCaseWithPrograms (tcu::TestContext&								testCtx,
										  tcu::TestNodeType								type,
										  const std::string&							name,
										  const std::string&							desc,
										  typename FunctionPrograms1<Arg0>::Function	initPrograms,
										  typename FunctionInstance1<Arg0>::Function	testFunction,
										  Arg0											arg0)
{
	return new InstanceFactory1<FunctionInstance1<Arg0>, typename FunctionInstance1<Arg0>::Args, FunctionPrograms1<Arg0> >(
		testCtx, type, name, desc, FunctionPrograms1<Arg0>(initPrograms), typename FunctionInstance1<Arg0>::Args(testFunction, arg0));
}